

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O2

void __thiscall
wasm::OptUtils::FunctionRefReplacer::FunctionRefReplacer
          (FunctionRefReplacer *this,MaybeReplace *maybeReplace)

{
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionRefReplacer_01120940;
  std::function<void_(wasm::Name_&)>::function(&this->maybeReplace,maybeReplace);
  return;
}

Assistant:

FunctionRefReplacer(MaybeReplace maybeReplace) : maybeReplace(maybeReplace) {}